

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O1

void Macro_smpsModOn(uint arg_count,long *arg_array)

{
  uchar byte;
  
  if (target_driver < 3) {
    if (arg_count != 0) {
      puts(
          "Warning: Modulation envelopes are not supported in Sonic 1 or Sonic 2 drivers. smpsModOn flag won\'t work properly."
          );
      return;
    }
    byte = 0xf1;
  }
  else {
    MemoryStream_WriteByte(output_stream,0xf4);
    if (arg_count == 0) {
      byte = 0x80;
    }
    else {
      byte = (uchar)*arg_array;
    }
  }
  MemoryStream_WriteByte(output_stream,byte);
  return;
}

Assistant:

static void Macro_smpsModOn(unsigned int arg_count, long arg_array[])
{
	if (target_driver >= 3)
	{
		WriteByte(0xF4);

		if (arg_count >= 1)
			WriteByte(arg_array[0]);
		else
			WriteByte(0x80);
	}
	else
	{
		if (arg_count >= 1)
			printf("Warning: Modulation envelopes are not supported in Sonic 1 or Sonic 2 drivers. smpsModOn flag won't work properly.\n");
		else
			WriteByte(0xF1);
	}
}